

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wuser_start_label(OutputFile *this)

{
  reference ppOVar1;
  ulong uVar2;
  OutputFile *this_00;
  undefined1 local_30 [8];
  string label;
  OutputFile *this_local;
  
  label.field_2._8_8_ = this;
  ppOVar1 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::back
                      (&this->blocks);
  std::__cxx11::string::string((string *)local_30,(string *)&(*ppOVar1)->user_start_label);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = wstring(this,(string *)local_30);
    ws(this_00,":\n");
  }
  std::__cxx11::string::~string((string *)local_30);
  return this;
}

Assistant:

OutputFile & OutputFile::wuser_start_label ()
{
	const std::string label = blocks.back ()->user_start_label;
	if (!label.empty ())
	{
		wstring(label).ws(":\n");
	}
	return *this;
}